

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_read_header(archive_read *a,archive_entry *entry)

{
  archive_entry *paVar1;
  wchar_t wVar2;
  mode_t mVar3;
  int iVar4;
  archive_string_conv *paVar5;
  int *piVar6;
  char *pcVar7;
  int local_4c;
  long lStack_48;
  int r;
  size_t name_pad;
  size_t namelength;
  archive_string_conv *sconv;
  void *h;
  cpio *cpio;
  archive_entry *entry_local;
  archive_read *a_local;
  
  h = a->format->data;
  namelength = *(size_t *)((long)h + 0x38);
  cpio = (cpio *)entry;
  entry_local = (archive_entry *)a;
  if (namelength == 0) {
    if (*(int *)((long)h + 0x48) == 0) {
      paVar5 = archive_string_default_conversion_for_read(&a->archive);
      *(archive_string_conv **)((long)h + 0x40) = paVar5;
      *(undefined4 *)((long)h + 0x48) = 1;
    }
    namelength = *(size_t *)((long)h + 0x40);
  }
  local_4c = (**(code **)((long)h + 8))(entry_local,h,cpio,&name_pad,&stack0xffffffffffffffb8);
  a_local._4_4_ = local_4c;
  if (-0x15 < local_4c) {
    sconv = (archive_string_conv *)
            __archive_read_ahead((archive_read *)entry_local,name_pad + lStack_48,(ssize_t *)0x0);
    if (sconv == (archive_string_conv *)0x0) {
      a_local._4_4_ = -0x1e;
    }
    else {
      wVar2 = _archive_entry_copy_pathname_l
                        ((archive_entry *)cpio,(char *)sconv,name_pad,
                         (archive_string_conv *)namelength);
      if (wVar2 != L'\0') {
        piVar6 = __errno_location();
        paVar1 = entry_local;
        if (*piVar6 == 0xc) {
          archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
          return -0x1e;
        }
        pcVar7 = archive_string_conversion_charset_name((archive_string_conv *)namelength);
        archive_set_error((archive *)paVar1,0x54,
                          "Pathname can\'t be converted from %s to current locale.",pcVar7);
        local_4c = -0x14;
      }
      *(undefined8 *)((long)h + 0x28) = 0;
      __archive_read_consume((archive_read *)entry_local,name_pad + lStack_48);
      mVar3 = archive_entry_filetype((archive_entry *)cpio);
      if (mVar3 == 0xa000) {
        sconv = (archive_string_conv *)
                __archive_read_ahead
                          ((archive_read *)entry_local,*(size_t *)((long)h + 0x18),(ssize_t *)0x0);
        if (sconv == (archive_string_conv *)0x0) {
          return -0x1e;
        }
        wVar2 = _archive_entry_copy_symlink_l
                          ((archive_entry *)cpio,(char *)sconv,*(size_t *)((long)h + 0x18),
                           (archive_string_conv *)namelength);
        if (wVar2 != L'\0') {
          piVar6 = __errno_location();
          paVar1 = entry_local;
          if (*piVar6 == 0xc) {
            archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          pcVar7 = archive_string_conversion_charset_name((archive_string_conv *)namelength);
          archive_set_error((archive *)paVar1,0x54,
                            "Linkname can\'t be converted from %s to current locale.",pcVar7);
          local_4c = -0x14;
        }
        __archive_read_consume((archive_read *)entry_local,*(int64_t *)((long)h + 0x18));
        *(undefined8 *)((long)h + 0x18) = 0;
      }
      if ((name_pad == 0xb) && (iVar4 = strcmp((char *)sconv,"TRAILER!!!"), iVar4 == 0)) {
        archive_clear_error((archive *)entry_local);
        a_local._4_4_ = 1;
      }
      else {
        iVar4 = record_hardlink((archive_read *)entry_local,(cpio *)h,(archive_entry *)cpio);
        if (iVar4 == 0) {
          a_local._4_4_ = local_4c;
        }
        else {
          a_local._4_4_ = -0x1e;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_cpio_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct cpio *cpio;
	const void *h;
	struct archive_string_conv *sconv;
	size_t namelength;
	size_t name_pad;
	int r;

	cpio = (struct cpio *)(a->format->data);
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_read(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	
	r = (cpio->read_header(a, cpio, entry, &namelength, &name_pad));

	if (r < ARCHIVE_WARN)
		return (r);

	/* Read name from buffer. */
	h = __archive_read_ahead(a, namelength + name_pad, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);
	if (archive_entry_copy_pathname_l(entry,
	    (const char *)h, namelength, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname can't be converted from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		r = ARCHIVE_WARN;
	}
	cpio->entry_offset = 0;

	__archive_read_consume(a, namelength + name_pad);

	/* If this is a symlink, read the link contents. */
	if (archive_entry_filetype(entry) == AE_IFLNK) {
		h = __archive_read_ahead(a,
			(size_t)cpio->entry_bytes_remaining, NULL);
		if (h == NULL)
			return (ARCHIVE_FATAL);
		if (archive_entry_copy_symlink_l(entry, (const char *)h,
		    (size_t)cpio->entry_bytes_remaining, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname can't be converted from %s to "
			    "current locale.",
			    archive_string_conversion_charset_name(sconv));
			r = ARCHIVE_WARN;
		}
		__archive_read_consume(a, cpio->entry_bytes_remaining);
		cpio->entry_bytes_remaining = 0;
	}

	/* XXX TODO: If the full mode is 0160200, then this is a Solaris
	 * ACL description for the following entry.  Read this body
	 * and parse it as a Solaris-style ACL, then read the next
	 * header.  XXX */

	/* Compare name to "TRAILER!!!" to test for end-of-archive. */
	if (namelength == 11 && strcmp((const char *)h, "TRAILER!!!") == 0) {
		/* TODO: Store file location of start of block. */
		archive_clear_error(&a->archive);
		return (ARCHIVE_EOF);
	}

	/* Detect and record hardlinks to previously-extracted entries. */
	if (record_hardlink(a, cpio, entry) != ARCHIVE_OK) {
		return (ARCHIVE_FATAL);
	}

	return (r);
}